

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemIdentifier.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::SystemIdentifier::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,SystemIdentifier *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  SystemIdentifier *local_18;
  SystemIdentifier *this_local;
  
  local_18 = this;
  this_local = (SystemIdentifier *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"System Identifier:");
  poVar1 = std::operator<<(poVar1,"\n\tType:           ");
  ENUMS::GetEnumAsStringSystemType_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)this->m_ui16SystemType,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\n\tName:           ");
  ENUMS::GetEnumAsStringSystemName_abi_cxx11_
            (&local_1f0,(ENUMS *)(ulong)this->m_ui16SystemName,Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\n\tMode:           ");
  ENUMS::GetEnumAsStringSystemMode_abi_cxx11_
            (&local_210,(ENUMS *)(ulong)this->m_ui8SystemMode,Value_01);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"\n\tChange/Options: ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(bool)((this->field_3).m_ui8ChangeOptions & 1));
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  if ((this->m_ui16SystemType == 2) || (this->m_ui16SystemType == 1)) {
    poVar1 = std::operator<<(local_190,"\tAlt Mode 4: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->field_3).m_ui8ChangeOptions >> 1 & 1)
    ;
    poVar1 = std::operator<<(poVar1,"\n\tAlt Mode C:  ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->field_3).m_ui8ChangeOptions >> 2 & 1)
    ;
    std::operator<<(poVar1,"\n");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString SystemIdentifier::GetAsString() const
{
    KStringStream ss;

    ss << "System Identifier:"
       << "\n\tType:           " << GetEnumAsStringSystemType( m_ui16SystemType )
       << "\n\tName:           " << GetEnumAsStringSystemName( m_ui16SystemName )
       << "\n\tMode:           " << GetEnumAsStringSystemMode( m_ui8SystemMode )
       << "\n\tChange/Options: " << ( KBOOL )m_ui8ChangeIndicator
       << "\n";

    if( m_ui16SystemType == Mark_X_XII_ATCRBS_ModeS_Interrogator ||
            m_ui16SystemType == Mark_X_XII_ATCRBS_ModeS_Transponder )
    {
        ss << "\tAlt Mode 4: " << ( KUINT16 )m_ui8AltMode4
           << "\n\tAlt Mode C:  " << ( KUINT16 )m_ui8AltModeC
           << "\n";
    }

    return ss.str();
}